

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# payload.hpp
# Opt level: O0

FormatError
trackerboy::readPayloadImpl<trackerboy::WaveHandler>
          (Module *mod,InputBlock *block,WaveHandler *handler)

{
  bool bVar1;
  BlockId BVar2;
  BlockId BVar3;
  FormatError FVar4;
  size_t sVar5;
  ulong uStack_38;
  FormatError error;
  size_t i;
  size_t count;
  WaveHandler *handler_local;
  InputBlock *block_local;
  Module *mod_local;
  
  sVar5 = PayloadHandler<1163280727U>::count((PayloadHandler<1163280727U> *)handler);
  uStack_38 = 0;
  while( true ) {
    if (sVar5 <= uStack_38) {
      return none;
    }
    BVar2 = InputBlock::begin(block);
    BVar3 = PayloadHandler<1163280727U>::id((PayloadHandler<1163280727U> *)handler);
    if (BVar2 != BVar3) {
      return invalid;
    }
    FVar4 = WaveHandler::processIn(handler,mod,block,uStack_38);
    if (FVar4 != none) {
      return FVar4;
    }
    bVar1 = InputBlock::finished(block);
    if (!bVar1) break;
    uStack_38 = uStack_38 + 1;
  }
  return invalid;
}

Assistant:

FormatError readPayloadImpl(Module &mod, InputBlock &block, T& handler) {
    auto const count = handler.count();

    // TODO: optimize this for single block handlers (ie COMM block)
    // if we only need to read 1 block, we don't need the for loop
    for (size_t i = 0; i < count; ++i) {
        if (block.begin() != handler.id()) {
            return FormatError::invalid;
        }

        auto error = handler.processIn(mod, block, i);
        if (error != FormatError::none) {
            return error;
        }

        if (!block.finished()) {
            return FormatError::invalid;
        }
    }

    return FormatError::none;
}